

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O3

void __thiscall Percentile::~Percentile(Percentile *this)

{
  ~Percentile(this);
  operator_delete(this);
  return;
}

Assistant:

Percentile::~Percentile()
{
}